

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::OutputTestResult(JunitReporter *this,XmlWriter *xml,TestCaseStats *stats)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ScopedElement e;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  XmlWriter *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  XmlWriter *in_stack_ffffffffffffff68;
  undefined1 local_89 [56];
  undefined1 local_51 [49];
  __normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
  local_20 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_current =
       (TestStats *)
       std::
       vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>::
       begin(in_stack_ffffffffffffff38);
  local_51._41_8_ =
       std::
       vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>::
       end(in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
                             *)in_stack_ffffffffffffff40,
                            (__normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
    ::operator->(local_20);
    bVar1 = std::operator!=(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
      ::operator->(local_20);
      XmlWriter::scopedElement(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff68 = (XmlWriter *)local_51;
      in_stack_ffffffffffffff60 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_51 + 1),"message",(allocator *)in_stack_ffffffffffffff68);
      __gnu_cxx::
      __normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
      ::operator->(local_20);
      XmlWriter::writeAttribute
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::__cxx11::string::~string((string *)(local_51 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_51);
      in_stack_ffffffffffffff50 = (XmlWriter *)local_89;
      in_stack_ffffffffffffff48 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_89 + 1),"type",(allocator *)in_stack_ffffffffffffff50);
      __gnu_cxx::
      __normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
      ::operator->(local_20);
      XmlWriter::writeAttribute
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::__cxx11::string::~string((string *)(local_89 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_89);
      __gnu_cxx::
      __normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
      ::operator->(local_20);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        in_stack_ffffffffffffff40 = local_10;
        __gnu_cxx::
        __normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
        ::operator->(local_20);
        XmlWriter::writeText
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_ffffffffffffff40);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::JunitReporter::TestStats_*,_std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void OutputTestResult( XmlWriter& xml, const TestCaseStats& stats ) {
            std::vector<TestStats>::const_iterator it = stats.m_testStats.begin();
            std::vector<TestStats>::const_iterator itEnd = stats.m_testStats.end();
            for(; it != itEnd; ++it ) {
                if( it->m_element != "success" ) {
                    XmlWriter::ScopedElement e = xml.scopedElement( it->m_element );

                    xml.writeAttribute( "message", it->m_message );
                    xml.writeAttribute( "type", it->m_resultType );
                    if( !it->m_content.empty() )
                        xml.writeText( it->m_content );
                }
            }
        }